

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_max_op<int,int,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<int,-1,1,0,-1,1>>,3,0>
       ::run<Eigen::Matrix<int,_1,1,0,_1,1>>
                 (redux_evaluator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *eval,
                 scalar_max_op<int,_int,_0> *func,Matrix<int,__1,_1,_0,__1,_1> *xpr)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  uint *puVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  Index index_1;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  PacketScalar packet_res0;
  
  lVar3 = (xpr->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  lVar8 = 8;
  if (lVar3 + 3U < 7) {
    piVar4 = (eval->super_evaluator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>.m_d.data
    ;
    iVar6 = *piVar4;
    for (lVar8 = 1; lVar8 < lVar3; lVar8 = lVar8 + 1) {
      iVar2 = piVar4[lVar8];
      if (iVar6 <= iVar2) {
        iVar6 = iVar2;
      }
    }
  }
  else {
    lVar9 = (lVar3 / 4) * 4;
    puVar5 = (uint *)(eval->super_evaluator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>.
                     m_d.data;
    packet_res0.m_val[0]._0_4_ = *puVar5;
    packet_res0.m_val[0]._4_4_ = puVar5[1];
    packet_res0.m_val[1]._0_4_ = puVar5[2];
    packet_res0.m_val[1]._4_4_ = puVar5[3];
    if (7 < lVar3) {
      lVar7 = (lVar3 / 8) * 8;
      uVar10 = puVar5[4];
      uVar11 = puVar5[5];
      uVar12 = puVar5[6];
      uVar13 = puVar5[7];
      for (; lVar8 < lVar7; lVar8 = lVar8 + 8) {
        puVar1 = puVar5 + lVar8;
        uVar14 = -(uint)((int)*puVar1 < (int)(uint)packet_res0.m_val[0]);
        uVar15 = -(uint)((int)puVar1[1] < (int)packet_res0.m_val[0]._4_4_);
        uVar16 = -(uint)((int)puVar1[2] < (int)(uint)packet_res0.m_val[1]);
        uVar17 = -(uint)((int)puVar1[3] < (int)packet_res0.m_val[1]._4_4_);
        packet_res0.m_val[0]._0_4_ = (uint)packet_res0.m_val[0] & uVar14 | ~uVar14 & *puVar1;
        packet_res0.m_val[0]._4_4_ = packet_res0.m_val[0]._4_4_ & uVar15 | ~uVar15 & puVar1[1];
        packet_res0.m_val[1]._0_4_ = (uint)packet_res0.m_val[1] & uVar16 | ~uVar16 & puVar1[2];
        packet_res0.m_val[1]._4_4_ = packet_res0.m_val[1]._4_4_ & uVar17 | ~uVar17 & puVar1[3];
        puVar1 = puVar5 + 4 + lVar8;
        uVar14 = -(uint)((int)*puVar1 < (int)uVar10);
        uVar15 = -(uint)((int)puVar1[1] < (int)uVar11);
        uVar16 = -(uint)((int)puVar1[2] < (int)uVar12);
        uVar17 = -(uint)((int)puVar1[3] < (int)uVar13);
        uVar10 = uVar10 & uVar14 | ~uVar14 & *puVar1;
        uVar11 = uVar11 & uVar15 | ~uVar15 & puVar1[1];
        uVar12 = uVar12 & uVar16 | ~uVar16 & puVar1[2];
        uVar13 = uVar13 & uVar17 | ~uVar17 & puVar1[3];
      }
      packet_res0.m_val[0]._0_4_ =
           ~-(uint)((int)uVar10 < (int)(uint)packet_res0.m_val[0]) & uVar10 |
           (uint)packet_res0.m_val[0] & -(uint)((int)uVar10 < (int)(uint)packet_res0.m_val[0]);
      packet_res0.m_val[0]._4_4_ =
           ~-(uint)((int)uVar11 < (int)packet_res0.m_val[0]._4_4_) & uVar11 |
           packet_res0.m_val[0]._4_4_ & -(uint)((int)uVar11 < (int)packet_res0.m_val[0]._4_4_);
      packet_res0.m_val[1]._0_4_ =
           ~-(uint)((int)uVar12 < (int)(uint)packet_res0.m_val[1]) & uVar12 |
           (uint)packet_res0.m_val[1] & -(uint)((int)uVar12 < (int)(uint)packet_res0.m_val[1]);
      packet_res0.m_val[1]._4_4_ =
           ~-(uint)((int)uVar13 < (int)packet_res0.m_val[1]._4_4_) & uVar13 |
           packet_res0.m_val[1]._4_4_ & -(uint)((int)uVar13 < (int)packet_res0.m_val[1]._4_4_);
      if (lVar7 < lVar9) {
        puVar5 = puVar5 + (lVar3 / 8) * 8;
        uVar10 = -(uint)((int)*puVar5 < (int)(uint)packet_res0.m_val[0]);
        uVar11 = -(uint)((int)puVar5[1] < (int)packet_res0.m_val[0]._4_4_);
        uVar12 = -(uint)((int)puVar5[2] < (int)(uint)packet_res0.m_val[1]);
        uVar13 = -(uint)((int)puVar5[3] < (int)packet_res0.m_val[1]._4_4_);
        packet_res0.m_val[0]._0_4_ = ~uVar10 & *puVar5 | (uint)packet_res0.m_val[0] & uVar10;
        packet_res0.m_val[0]._4_4_ = ~uVar11 & puVar5[1] | packet_res0.m_val[0]._4_4_ & uVar11;
        packet_res0.m_val[1]._0_4_ = ~uVar12 & puVar5[2] | (uint)packet_res0.m_val[1] & uVar12;
        packet_res0.m_val[1]._4_4_ = ~uVar13 & puVar5[3] | packet_res0.m_val[1]._4_4_ & uVar13;
      }
    }
    iVar6 = predux_max<0,Eigen::internal::eigen_packet_wrapper<long_long__vector(2),0>>
                      (&packet_res0);
    for (; lVar9 < lVar3; lVar9 = lVar9 + 1) {
      iVar2 = (eval->super_evaluator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>.m_d.
              data[lVar9];
      if (iVar6 <= iVar2) {
        iVar6 = iVar2;
      }
    }
  }
  return iVar6;
}

Assistant:

static Scalar run(const Evaluator &eval, const Func& func, const XprType& xpr)
  {
    const Index size = xpr.size();
    
    const Index packetSize = redux_traits<Func, Evaluator>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Evaluator::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Evaluator::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(xpr);
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = eval.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = eval.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, eval.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,eval.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,eval.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = eval.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,eval.coeff(index));
    }

    return res;
  }